

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

lua_State * lua_newthread(lua_State *L)

{
  int iVar1;
  global_State *pgVar2;
  StkId pSVar3;
  lua_State *L1;
  lua_State *x_;
  
  pgVar2 = L->l_G;
  if (pgVar2->GCdebt < 1) {
    luaC_step(L);
  }
  L1 = (lua_State *)luaC_newobjdt(L,'\b',0xd8,8);
  pSVar3 = (L->top).p;
  *(lua_State **)pSVar3 = L1;
  (pSVar3->val).tt_ = 'H';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  L1->l_G = pgVar2;
  (L1->stack).p = (StkId)0x0;
  L1->openupval = (UpVal *)0x0;
  L1->ci = (CallInfo *)0x0;
  L1->nci = 0;
  L1->basehookcount = 0;
  L1->twups = L1;
  L1->errorJmp = (lua_longjmp *)0x0;
  L1->hook = (lua_Hook)0x0;
  L1->hookmask = 0;
  L1->allowhook = '\x01';
  L1->status = '\0';
  L1->errfunc = 0;
  L1->nCcalls = 0;
  L1->oldpc = 0;
  (L1->base_ci).previous = (CallInfo *)0x0;
  (L1->base_ci).next = (CallInfo *)0x0;
  L1->hookmask = L->hookmask;
  iVar1 = L->basehookcount;
  L1->basehookcount = iVar1;
  L1->hook = L->hook;
  L1->hookcount = iVar1;
  L1[-1].transferinfo = *(anon_struct_8_2_9c65610d_for_transferinfo *)(pgVar2->mainth).extra_;
  stack_init(L1,L);
  return L1;
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  global_State *g = G(L);
  GCObject *o;
  lua_State *L1;
  lua_lock(L);
  luaC_checkGC(L);
  /* create new thread */
  o = luaC_newobjdt(L, LUA_TTHREAD, sizeof(LX), offsetof(LX, l));
  L1 = gco2th(o);
  /* anchor it on L stack */
  setthvalue2s(L, L->top.p, L1);
  api_incr_top(L);
  preinit_thread(L1, g);
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  /* initialize L1 extra space */
  memcpy(lua_getextraspace(L1), lua_getextraspace(mainthread(g)),
         LUA_EXTRASPACE);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}